

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
FormatterTest_FormatInfinity_Test::~FormatterTest_FormatInfinity_Test
          (FormatterTest_FormatInfinity_Test *this)

{
  void *in_RDI;
  
  ~FormatterTest_FormatInfinity_Test((FormatterTest_FormatInfinity_Test *)0x19fd18);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(FormatterTest, FormatInfinity) {
  double inf = std::numeric_limits<double>::infinity();
  EXPECT_EQ("inf", format("{}", inf));
  EXPECT_EQ("+inf", format("{:+}", inf));
  EXPECT_EQ("-inf", format("{}", -inf));
  EXPECT_EQ(" inf", format("{: }", inf));
  EXPECT_EQ("INF", format("{:F}", inf));
  EXPECT_EQ("inf    ", format("{:<7}", inf));
  EXPECT_EQ("  inf  ", format("{:^7}", inf));
  EXPECT_EQ("    inf", format("{:>7}", inf));
}